

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O2

int Ses_StoreTruthEqual(Ses_TruthEntry_t *pEntry,word *pTruth,int nVars)

{
  word *pwVar1;
  word *pwVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (pEntry->nVars == nVars) {
    bVar3 = (char)nVars - 6U & 0x1f;
    uVar4 = 1 << bVar3;
    if (1 << bVar3 < 1) {
      uVar4 = 0;
    }
    uVar6 = (ulong)uVar4;
    uVar5 = 0;
    if (nVars < 7) {
      uVar6 = 1;
    }
    do {
      if (uVar6 == uVar5) {
        return 1;
      }
      pwVar1 = pEntry->pTruth + uVar5;
      pwVar2 = pTruth + uVar5;
      uVar5 = uVar5 + 1;
    } while (*pwVar1 == *pwVar2);
  }
  return 0;
}

Assistant:

static inline int Ses_StoreTruthEqual( Ses_TruthEntry_t * pEntry, word * pTruth, int nVars )
{
    int i;

    if ( pEntry->nVars != nVars )
        return 0;

    for ( i = 0; i < Abc_TtWordNum( nVars ); ++i )
        if ( pEntry->pTruth[i] != pTruth[i] )
            return 0;
    return 1;
}